

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall
tchecker::ta::system_t::set_guards
          (system_t *this,edge_id_t id,
          range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
          *guards)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  clocks_t *pcVar3;
  bytecode_t *pbVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  invalid_argument *this_00;
  typed_expression_t *__tmp;
  long *__tmp_1;
  shared_ptr<tchecker::typed_expression_t> guard_typed_expr;
  shared_ptr<tchecker::expression_t> guard_expr;
  integer_variables_t localvars;
  shared_ptr<long> guard_bytecode;
  typed_expression_t *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  local_348;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  clock_variables_t local_2f0;
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  undefined8 local_208;
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  undefined8 local_1b8;
  bytecode_t *local_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8 [48];
  
  memset(&local_2f0,0,0xa0);
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::variables_t(&local_250,
                (variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
  pcVar3 = &(this->super_system_t).super_system_t.super_clocks_t;
  local_208._0_4_ =
       (pcVar3->_clock_variables).
       super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._first_id;
  local_208._4_4_ =
       (pcVar3->_clock_variables).
       super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._next_id;
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::variables_t(&local_200,
                (variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this->super_system_t).super_system_t.super_clocks_t._clock_variables.
                    super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._flattened_variables);
  local_1b8 = *(undefined8 *)
               ((long)&(this->super_system_t).super_system_t.super_clocks_t._clock_variables.
                       super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._flattened_variables.
                       super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               + 0x48);
  conjunction_from_attributes
            (&local_348,
             (integer_variables_t *)
             (guards->_begin).super_const_iterator.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
             ._M_cur,(integer_variables_t *)
                     (guards->_end).super_const_iterator.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                     ._M_cur,&local_2f0);
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~variables_t(&local_200);
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~variables_t(&local_250);
  if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
       )local_348._begin.super_const_iterator.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
        ._M_cur ==
      (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
       )0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Syntax error");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_320 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_tchecker::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/expression/typechecking.hh:40:54)>
              ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_tchecker::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/expression/typechecking.hh:40:54)>
              ::_M_manager;
  typecheck((tchecker *)&local_358,
            (expression_t *)
            local_348._begin.super_const_iterator.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
            ._M_cur,(integer_variables_t *)&local_2f0,
            &(this->super_system_t).super_system_t.super_intvars_t._integer_variables,
            (clock_variables_t *)this,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_338);
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,__destroy_functor);
  }
  bVar6 = bool_valued(local_358->_type);
  if (bVar6) {
    local_1b0 = compile(local_358);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<long*,std::default_delete<long[]>,std::allocator<void>,void>(local_1a8,local_1b0)
    ;
    _Var5._M_pi = local_1a8[0]._M_pi;
    pbVar4 = local_1b0;
    if (local_350 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_350->_M_use_count = local_350->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_350->_M_use_count = local_350->_M_use_count + 1;
      }
    }
    if (local_1a8[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a8[0]._M_pi)->_M_use_count = (local_1a8[0]._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a8[0]._M_pi)->_M_use_count = (local_1a8[0]._M_pi)->_M_use_count + 1;
      }
    }
    pcVar1 = (this->_guards).
             super__Vector_base<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar1[id]._typed_expr.
    super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_358;
    p_Var2 = pcVar1[id]._typed_expr.
             super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    pcVar1[id]._typed_expr.
    super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_350;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    pcVar1[id]._compiled_expr.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pbVar4;
    p_Var2 = pcVar1[id]._compiled_expr.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    pcVar1[id]._compiled_expr.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var5._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (local_1a8[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8[0]._M_pi);
    }
    if (local_350 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350);
    }
    if (local_348._end.super_const_iterator.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
        ._M_cur !=
        (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
         )0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_348._end.super_const_iterator.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                 ._M_cur);
    }
    variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~variables_t((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2f0.
                       super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._flattened_variables);
    variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~variables_t((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2f0);
    return;
  }
  __assert_fail("tchecker::bool_valued(guard_typed_expr->type())",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                ,0xe6,
                "void tchecker::ta::system_t::set_guards(tchecker::edge_id_t, const tchecker::range_t<tchecker::system::attributes_t::const_iterator_t> &)"
               );
}

Assistant:

void system_t::set_guards(tchecker::edge_id_t id,
                          tchecker::range_t<tchecker::system::attributes_t::const_iterator_t> const & guards)
{
  tchecker::integer_variables_t localvars;

  std::shared_ptr<tchecker::expression_t> guard_expr{
      conjunction_from_attributes(guards, localvars, integer_variables(), clock_variables())};
  if (guard_expr.get() == nullptr)
    throw std::invalid_argument("Syntax error");

  std::shared_ptr<tchecker::typed_expression_t> guard_typed_expr{
      tchecker::typecheck(*guard_expr, localvars, integer_variables(), clock_variables())};
  assert(tchecker::bool_valued(guard_typed_expr->type()));

  try {
    std::shared_ptr<tchecker::bytecode_t> guard_bytecode{tchecker::compile(*guard_typed_expr),
                                                         std::default_delete<tchecker::bytecode_t[]>()};
    _guards[id] = {guard_typed_expr, guard_bytecode};
  }
  catch (std::exception const & e) {
    std::stringstream oss;
    oss << e.what();
    throw std::invalid_argument(oss.str());
  }
}